

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O1

ostream * arangodb::velocypack::operator<<(ostream *stream,HexDump *hexdump)

{
  string local_30;
  
  HexDump::toString_abi_cxx11_(&local_30,hexdump);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, HexDump const& hexdump) {
  stream << hexdump.toString();
  return stream;
}